

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::anon_unknown_1::reduce<float>
               (float *src,int sstride,int uw,int vw,float *dst,int dstride,int nchan)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  float *in_RDI;
  float *in_R8;
  int in_R9D;
  float fVar5;
  int in_stack_00000008;
  float *pixend;
  float *rowend;
  float *end;
  int drowskip;
  int srowskip;
  int rowlen;
  float *local_20;
  float *local_8;
  
  iVar1 = in_ESI / 4;
  iVar2 = in_EDX * in_stack_00000008;
  local_20 = in_R8;
  for (local_8 = in_RDI; local_8 != in_RDI + in_ECX * iVar1; local_8 = local_8 + (iVar1 * 2 - iVar2)
      ) {
    pfVar3 = local_8 + iVar2;
    for (; local_8 != pfVar3; local_8 = local_8 + in_stack_00000008) {
      pfVar4 = local_8 + in_stack_00000008;
      for (; local_8 != pfVar4; local_8 = local_8 + 1) {
        fVar5 = quarter(*local_8 + local_8[in_stack_00000008] + local_8[iVar1] +
                        local_8[iVar1 + in_stack_00000008]);
        *local_20 = fVar5;
        local_20 = local_20 + 1;
      }
    }
    local_20 = local_20 + (in_R9D / 4 - iVar2 / 2);
  }
  return;
}

Assistant:

inline void reduce(const T* src, int sstride, int uw, int vw,
                       T* dst, int dstride, int nchan)
    {
        sstride /= (int)sizeof(T);
        dstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int srowskip = 2*sstride - rowlen;
        int drowskip = dstride - rowlen/2;
        for (const T* end = src + vw*sstride; src != end;
             src += srowskip, dst += drowskip)
            for (const T* rowend = src + rowlen; src != rowend; src += nchan)
                for (const T* pixend = src+nchan; src != pixend; src++)
                    *dst++ = T(quarter(src[0] + src[nchan] + src[sstride] + src[sstride+nchan]));
    }